

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComparisonFunction::ComparisonFunction
          (ComparisonFunction *this,string *funcName,FunctionParameters funcParameters,
          string *funcImplementation)

{
  pointer pcVar1;
  long lVar2;
  undefined4 in_register_00000014;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (funcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + funcName->_M_string_length);
  this->parameters = FUNCTIONPARAMETERS_TWO;
  (this->implementation)._M_dataplus._M_p = (pointer)&(this->implementation).field_2;
  lVar2 = *(long *)CONCAT44(in_register_00000014,funcParameters);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->implementation,lVar2,
             ((long *)CONCAT44(in_register_00000014,funcParameters))[1] + lVar2);
  return;
}

Assistant:

ComparisonFunction		(const std::string& funcName, const FunctionParameters funcParameters, const std::string& funcImplementation)
		: name				(funcName)
		, parameters		(funcParameters)
		, implementation	(funcImplementation) {}